

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5_pnnx.cpp
# Opt level: O1

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  uint uVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  double dVar18;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar19 [16];
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar24;
  undefined1 auVar23 [16];
  ulong local_140;
  value_type local_a8;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  uVar7 = anchors->w / 2;
  iVar5 = in_pad->c / (int)uVar7;
  if (1 < anchors->w) {
    uVar2 = in_pad->w;
    uVar3 = in_pad->h;
    local_88._0_4_ = (undefined4)stride;
    local_88._4_4_ = local_88._0_4_;
    local_88._8_4_ = local_88._0_4_;
    local_88._12_4_ = local_88._0_4_;
    uVar6 = 5;
    local_140 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar9 = local_140 * (long)iVar5;
        uVar1 = *(undefined8 *)((long)anchors->data + local_140 * 8);
        local_78._0_8_ = (undefined8)(float)uVar1;
        local_78._8_8_ = (undefined8)(float)((ulong)uVar1 >> 0x20);
        uVar11 = 0;
        do {
          if (0 < (int)uVar2) {
            local_68 = ZEXT416((uint)(float)(int)uVar11);
            lVar13 = 0;
            uVar12 = 0;
            do {
              iVar14 = 0;
              fVar21 = -3.4028235e+38;
              if (5 < iVar5) {
                pfVar8 = (float *)(((ulong)uVar6 * in_pad->cstep + (long)in_pad->w * uVar11) *
                                   in_pad->elemsize + lVar13 + (long)in_pad->data);
                uVar10 = 0;
                uVar15 = 0;
                fVar21 = -3.4028235e+38;
                do {
                  if (fVar21 < *pfVar8) {
                    uVar15 = uVar10 & 0xffffffff;
                    fVar21 = *pfVar8;
                  }
                  iVar14 = (int)uVar15;
                  uVar10 = uVar10 + 1;
                  pfVar8 = (float *)((long)pfVar8 + in_pad->cstep * in_pad->elemsize);
                } while (iVar5 - 5 != uVar10);
              }
              fVar16 = expf(-*(float *)((long)in_pad->data +
                                       uVar12 * 4 +
                                       (long)in_pad->w * uVar11 * in_pad->elemsize +
                                       in_pad->cstep * (lVar9 + 4) * in_pad->elemsize));
              fVar21 = expf(-fVar21);
              auVar19._4_4_ = fVar21 + DAT_0054c0f0._4_4_;
              auVar19._0_4_ = fVar16 + (float)DAT_0054c0f0;
              auVar19._8_4_ = extraout_XMM0_Db + DAT_0054c0f0._8_4_;
              auVar19._12_4_ = extraout_XMM0_Db_00 + DAT_0054c0f0._12_4_;
              auVar19 = divps(_DAT_0054c0f0,auVar19);
              fVar21 = auVar19._4_4_ * auVar19._0_4_;
              if (0.25 <= fVar21) {
                fVar16 = expf(-*(float *)((long)in_pad->data +
                                         uVar12 * 4 +
                                         (long)in_pad->w * uVar11 * in_pad->elemsize +
                                         in_pad->cstep * lVar9 * in_pad->elemsize));
                local_48 = expf(-*(float *)((long)in_pad->data +
                                           uVar12 * 4 +
                                           (long)in_pad->w * uVar11 * in_pad->elemsize +
                                           in_pad->cstep * (lVar9 + 1) * in_pad->elemsize));
                fStack_44 = extraout_XMM0_Db_02;
                local_58 = expf(-*(float *)((long)in_pad->data +
                                           uVar12 * 4 +
                                           (long)in_pad->w * uVar11 * in_pad->elemsize +
                                           in_pad->cstep * (lVar9 + 2) * in_pad->elemsize));
                fStack_54 = extraout_XMM0_Db_03;
                fVar17 = expf(-*(float *)((long)in_pad->data +
                                         uVar12 * 4 +
                                         (long)in_pad->w * uVar11 * in_pad->elemsize +
                                         in_pad->cstep * (lVar9 + 3) * in_pad->elemsize));
                auVar23._4_4_ = local_48 + DAT_0054c0f0._4_4_;
                auVar23._0_4_ = fVar16 + (float)DAT_0054c0f0;
                auVar23._8_4_ = extraout_XMM0_Db_01 + DAT_0054c0f0._8_4_;
                auVar23._12_4_ = fStack_44 + DAT_0054c0f0._12_4_;
                auVar23 = divps(_DAT_0054c0f0,auVar23);
                auVar4._4_4_ = fVar17 + DAT_0054c0f0._4_4_;
                auVar4._0_4_ = local_58 + (float)DAT_0054c0f0;
                auVar4._8_4_ = fStack_54 + DAT_0054c0f0._8_4_;
                auVar4._12_4_ = extraout_XMM0_Db_04 + DAT_0054c0f0._12_4_;
                auVar19 = divps(_DAT_0054c0f0,auVar4);
                fVar22 = (auVar23._0_4_ + auVar23._0_4_ + -0.5 + (float)(int)uVar12) *
                         (float)local_88._0_4_;
                fVar24 = (auVar23._4_4_ + auVar23._4_4_ + -0.5 + (float)local_68._0_4_) *
                         (float)local_88._4_4_;
                dVar18 = (double)(auVar19._0_4_ + auVar19._0_4_);
                dVar20 = (double)(auVar19._4_4_ + auVar19._4_4_);
                fVar16 = (float)(dVar18 * dVar18 * (double)local_78._0_8_) * 0.5;
                fVar17 = (float)(dVar20 * dVar20 * (double)local_78._8_8_) * 0.5;
                local_a8.rect.x = fVar22 - fVar16;
                local_a8.rect.y = fVar24 - fVar17;
                local_a8.rect.width = (fVar16 + fVar22) - local_a8.rect.x;
                local_a8.rect.height = (fVar17 + fVar24) - local_a8.rect.y;
                local_a8.label = iVar14;
                local_a8.prob = fVar21;
                std::vector<Object,_std::allocator<Object>_>::push_back
                          ((vector<Object,_std::allocator<Object>_> *)feat_blob,&local_a8);
              }
              uVar12 = uVar12 + 1;
              lVar13 = lVar13 + 4;
            } while (uVar12 != uVar2);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar3);
      }
      local_140 = local_140 + 1;
      uVar6 = uVar6 + iVar5;
    } while (local_140 != uVar7);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid_x = feat_blob.w;
    const int num_grid_y = feat_blob.h;

    const int num_anchors = anchors.w / 2;

    const int num_class = feat_blob.c / num_anchors - 5;

    const int feat_offset = num_class + 5;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                // find class index with max class score
                int class_index = 0;
                float class_score = -FLT_MAX;
                for (int k = 0; k < num_class; k++)
                {
                    float score = feat_blob.channel(q * feat_offset + 5 + k).row(i)[j];
                    if (score > class_score)
                    {
                        class_index = k;
                        class_score = score;
                    }
                }

                float box_score = feat_blob.channel(q * feat_offset + 4).row(i)[j];

                float confidence = sigmoid(box_score) * sigmoid(class_score);

                if (confidence >= prob_threshold)
                {
                    // yolov5/models/yolo.py Detect forward
                    // y = x[i].sigmoid()
                    // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                    // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                    float dx = sigmoid(feat_blob.channel(q * feat_offset + 0).row(i)[j]);
                    float dy = sigmoid(feat_blob.channel(q * feat_offset + 1).row(i)[j]);
                    float dw = sigmoid(feat_blob.channel(q * feat_offset + 2).row(i)[j]);
                    float dh = sigmoid(feat_blob.channel(q * feat_offset + 3).row(i)[j]);

                    float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                    float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                    float pb_w = pow(dw * 2.f, 2) * anchor_w;
                    float pb_h = pow(dh * 2.f, 2) * anchor_h;

                    float x0 = pb_cx - pb_w * 0.5f;
                    float y0 = pb_cy - pb_h * 0.5f;
                    float x1 = pb_cx + pb_w * 0.5f;
                    float y1 = pb_cy + pb_h * 0.5f;

                    Object obj;
                    obj.rect.x = x0;
                    obj.rect.y = y0;
                    obj.rect.width = x1 - x0;
                    obj.rect.height = y1 - y0;
                    obj.label = class_index;
                    obj.prob = confidence;

                    objects.push_back(obj);
                }
            }
        }
    }
}